

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessage::~QErrorMessage(QErrorMessage *this)

{
  QErrorMessage *in_RDI;
  QtMessageHandler currentMessagHandler;
  QDialog *in_stack_fffffffffffffff0;
  
  *(undefined ***)&(in_RDI->super_QDialog).super_QWidget = &PTR_metaObject_00d22120;
  *(undefined ***)&(in_RDI->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QErrorMessage_00d222f8;
  if (in_RDI == qtMessageHandler) {
    qtMessageHandler = (QErrorMessage *)0x0;
    in_stack_fffffffffffffff0 =
         (QDialog *)
         qInstallMessageHandler((_func_void_QtMsgType_QMessageLogContext_ptr_QString_ptr *)0x0);
    if (in_stack_fffffffffffffff0 == (QDialog *)jump) {
      qInstallMessageHandler
                ((_func_void_QtMsgType_QMessageLogContext_ptr_QString_ptr *)originalMessageHandler);
    }
    else {
      qInstallMessageHandler
                ((_func_void_QtMsgType_QMessageLogContext_ptr_QString_ptr *)
                 in_stack_fffffffffffffff0);
    }
    originalMessageHandler = (QtMessageHandler)0x0;
  }
  QDialog::~QDialog(in_stack_fffffffffffffff0);
  return;
}

Assistant:

QErrorMessage::~QErrorMessage()
{
    if (this == qtMessageHandler) {
        qtMessageHandler = nullptr;
        QtMessageHandler currentMessagHandler = qInstallMessageHandler(nullptr);
        if (currentMessagHandler != jump)
            qInstallMessageHandler(currentMessagHandler);
        else
            qInstallMessageHandler(originalMessageHandler);
        originalMessageHandler = nullptr;
    }
}